

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTrendTime(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  optional<metaf::MetafTime> time;
  smatch match;
  _Storage<metaf::MetafTime,_true> local_b4;
  char local_a4;
  undefined2 local_a3;
  undefined1 local_a1;
  undefined2 local_a0;
  undefined1 local_9e;
  undefined5 local_9d;
  undefined3 uStack_98;
  undefined4 uStack_95;
  undefined4 uStack_91;
  undefined2 local_8c;
  undefined1 local_8a;
  undefined5 local_89;
  undefined3 uStack_84;
  undefined4 uStack_81;
  undefined4 uStack_7d;
  string_type local_78;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  undefined4 local_38;
  uint uStack_34;
  _Optional_payload_base<unsigned_int> _Stack_30;
  undefined8 uStack_28;
  
  if (fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,
                 "([FTA][MLT])(\\d\\d\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    }
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (s->_M_dataplus)._M_p;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),&local_58,
                     &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar3) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_78,&local_58,2);
    MetafTime::fromStringDDHHMM((optional<metaf::MetafTime> *)&local_b4._M_value,&local_78);
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_a4 != '\0') {
      local_38 = 0;
      uStack_34 = uStack_34 & 0xffffff00;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_78,&local_58,1);
      iVar4 = std::__cxx11::string::compare((char *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        _Stack_30 = (_Optional_payload_base<unsigned_int>)
                    local_b4._M_value.dayValue.super__Optional_base<unsigned_int,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_int>;
        uStack_28 = local_b4._8_8_;
        local_8c = local_a3;
        local_8a = local_a1;
        (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) =
             CONCAT44(uStack_34,local_38);
        *(optional<unsigned_int> *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0xc) =
             local_b4._M_value.dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x14) =
             local_b4._8_8_;
        *(char *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) =
             local_a4;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
             local_a3;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
             local_a1;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) =
             CONCAT35(uStack_84,local_89);
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) =
             uStack_81;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
             (undefined1)uStack_7d;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
             uStack_7d;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      }
      else {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_78,&local_58,1);
        iVar4 = std::__cxx11::string::compare((char *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (iVar4 == 0) {
          local_89 = local_b4._0_5_;
          uStack_84 = local_b4._5_3_;
          uStack_81 = (undefined4)local_b4._8_8_;
          uStack_7d = (undefined4)((ulong)local_b4._8_8_ >> 0x20);
          uVar2 = uStack_7d;
          local_a0 = local_a3;
          local_9e = local_a1;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::TrendGroup>._M_payload = 5;
          (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup =
               false;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0
          ;
          uStack_7d._0_1_ = (undefined1)((ulong)local_b4._8_8_ >> 0x20);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
               CONCAT53(local_89,CONCAT12(local_8a,local_8c));
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x25) =
               CONCAT17((undefined1)uStack_7d,CONCAT43(uStack_81,uStack_84));
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
               uVar2;
          *(char *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) =
               local_a4;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
               local_a3;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
               local_a1;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x34) =
               CONCAT35(uStack_98,local_9d);
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) =
               uStack_95;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               (undefined1)uStack_91;
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               uStack_91;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0
          ;
          uStack_7d = uVar2;
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::str(&local_78,&local_58,1);
          iVar4 = std::__cxx11::string::compare((char *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (iVar4 != 0) goto LAB_001a633c;
          local_9d = local_b4._0_5_;
          uStack_98 = local_b4._5_3_;
          uStack_95 = (undefined4)local_b4._8_8_;
          uStack_91 = (undefined4)((ulong)local_b4._8_8_ >> 0x20);
          uVar2 = uStack_91;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x47) =
               local_a1;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x45) =
               local_a3;
          *(undefined8 *)
           &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload
            .super__Optional_payload_base<metaf::TrendGroup>._M_payload = 6;
          (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup =
               false;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0
          ;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0
          ;
          uStack_91._0_1_ = (undefined1)((ulong)local_b4._8_8_ >> 0x20);
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
               CONCAT53(local_9d,CONCAT12(local_9e,local_a0));
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x39) =
               CONCAT17((undefined1)uStack_91,CONCAT43(uStack_95,uStack_98));
          *(undefined4 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x40) =
               uVar2;
          *(char *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) =
               local_a4;
          uStack_91 = uVar2;
        }
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      goto LAB_001a6352;
    }
  }
LAB_001a633c:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_001a6352:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTrendTime(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("([FTA][MLT])(\\d\\d\\d\\d)");
	static const auto matchType = 1, matchTime = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(match.str(matchTime));
	if (!time.has_value()) return notRecognised;
	TrendGroup result;
	if (match.str(matchType) == "FM") {
		result.t = Type::FROM;
		result.tFrom = time;
		return result;
	}
	if (match.str(matchType) == "TL") {
		result.t = Type::UNTIL;
		result.tTill = time;
		return result;
	}
	if (match.str(matchType) == "AT") {
		result.t = Type::AT;
		result.tAt = time;
		return result;
	}
	return notRecognised;
}